

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O3

bool __thiscall
ON_Extrusion::Evaluate
          (ON_Extrusion *this,double u,double v,int num_der,int array_stride,double *der_array,
          int quadrant,int *hint)

{
  ON_Line *this_00;
  ulong uVar1;
  ON_Curve *pOVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  ON_3dPoint P;
  ON_3dPoint P_00;
  ON_3dVector T_00;
  ON_3dVector T_01;
  int iVar6;
  double *pdVar7;
  ON_Xform *pOVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  double *pdVar12;
  ON_Xform *pOVar13;
  ON_3dVector *pOVar14;
  ulong uVar15;
  int iVar16;
  double *pdVar17;
  bool bVar18;
  byte bVar19;
  undefined4 uVar20;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  ON_3dVector T;
  ON_Xform xform0;
  ON_Xform xform1;
  double *local_1e0;
  double *local_1c8;
  double dStack_1a0;
  ON_3dVector local_180;
  ON_Xform local_168;
  ON_Xform local_e8;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  double dVar21;
  
  bVar19 = 0;
  pOVar2 = this->m_profile;
  if (pOVar2 == (ON_Curve *)0x0) {
    return false;
  }
  dVar21 = u;
  if (this->m_bTransposed == true) {
    if (quadrant != 2) {
      dVar21 = v;
      v = u;
      uVar10 = 2;
      if (quadrant != 4) goto LAB_003ca0c4;
      goto LAB_003ca0da;
    }
    uVar15 = 1;
  }
  else {
LAB_003ca0c4:
    uVar20 = SUB84(dVar21,0);
    uVar15 = 1;
    u = v;
    if ((quadrant == 1) || (uVar10 = quadrant, quadrant == 4)) goto LAB_003ca0f6;
LAB_003ca0da:
    uVar15 = (ulong)-(uint)((uVar10 & 0xfffffffe) == 2);
    v = dVar21;
  }
  uVar20 = SUB84(v,0);
LAB_003ca0f6:
  iVar6 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3b])
                    (uVar20,pOVar2,(ulong)(uint)num_der,(ulong)(uint)array_stride,der_array,uVar15);
  if ((char)iVar6 == '\0') {
    return false;
  }
  dVar21 = ON_Interval::NormalizedParameterAt(&this->m_path_domain,u);
  dVar22 = 1.0 - dVar21;
  ON_Xform::ON_Xform(&local_168);
  ON_Xform::ON_Xform(&local_e8);
  this_00 = &this->m_path;
  ON_Line::Tangent(&local_180,this_00);
  if (((0 < num_der) || (dVar22 != 0.0)) || (NAN(dVar22))) {
    ON_Line::PointAt(&local_48,this_00,(this->m_t).m_t[0]);
    pOVar14 = this->m_N;
    if (this->m_bHaveN[0] == false) {
      pOVar14 = (ON_3dVector *)0x0;
    }
    P.y = local_48.y;
    P.x = local_48.x;
    P.z = local_48.z;
    T_00.y = local_180.y;
    T_00.x = local_180.x;
    T_00.z = local_180.z;
    bVar18 = ON_GetEndCapTransformation
                       (P,T_00,this->m_up,pOVar14,&local_168,(ON_Xform *)0x0,(ON_Xform *)0x0);
    if (!bVar18) {
      return false;
    }
  }
  else {
    pOVar8 = &ON_Xform::Zero4x4;
    pOVar13 = &local_168;
    for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
      pOVar13->m_xform[0][0] = pOVar8->m_xform[0][0];
      pOVar8 = (ON_Xform *)((long)pOVar8 + ((ulong)bVar19 * -2 + 1) * 8);
      pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar19 * -2 + 1) * 8);
    }
  }
  if (((0 < num_der) || (dVar21 != 0.0)) || (NAN(dVar21))) {
    ON_Line::PointAt(&local_60,this_00,(this->m_t).m_t[1]);
    pOVar14 = this->m_N + 1;
    if (this->m_bHaveN[1] == false) {
      pOVar14 = (ON_3dVector *)0x0;
    }
    P_00.y = local_60.y;
    P_00.x = local_60.x;
    P_00.z = local_60.z;
    T_01.y = local_180.y;
    T_01.x = local_180.x;
    T_01.z = local_180.z;
    bVar18 = ON_GetEndCapTransformation
                       (P_00,T_01,this->m_up,pOVar14,&local_e8,(ON_Xform *)0x0,(ON_Xform *)0x0);
    if (!bVar18) {
      return false;
    }
  }
  else {
    pOVar8 = &ON_Xform::Zero4x4;
    pOVar13 = &local_e8;
    for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
      pOVar13->m_xform[0][0] = pOVar8->m_xform[0][0];
      pOVar8 = (ON_Xform *)((long)pOVar8 + ((ulong)bVar19 * -2 + 1) * 8);
      pOVar13 = (ON_Xform *)((long)pOVar13 + ((ulong)bVar19 * -2 + 1) * 8);
    }
  }
  dVar23 = dVar22 * local_168.m_xform[0][0] + dVar21 * local_e8.m_xform[0][0];
  dVar24 = dVar22 * local_168.m_xform[1][0] + dVar21 * local_e8.m_xform[1][0];
  dVar4 = dVar22 * local_168.m_xform[0][1] + dVar21 * local_e8.m_xform[0][1];
  dVar31 = dVar22 * local_168.m_xform[1][1] + dVar21 * local_e8.m_xform[1][1];
  auVar3._8_4_ = SUB84(dVar31,0);
  auVar3._0_8_ = dVar4;
  auVar3._12_4_ = (int)((ulong)dVar31 >> 0x20);
  dVar25 = dVar22 * local_168.m_xform[2][0] + dVar21 * local_e8.m_xform[2][0];
  dVar26 = dVar22 * local_168.m_xform[2][1] + dVar21 * local_e8.m_xform[2][1];
  pdVar7 = der_array + ((int)((num_der + 2) * (num_der + 1U)) / 2 + -1) * array_stride;
  lVar11 = (long)array_stride;
  dVar31 = der_array[array_stride * num_der];
  dVar33 = (der_array + array_stride * num_der)[1];
  dStack_1a0 = auVar3._8_8_;
  if (0 < num_der) {
    dVar27 = (this->m_path_domain).m_t[1] - (this->m_path_domain).m_t[0];
    pdVar12 = der_array + array_stride * num_der;
    dVar5 = (double)(~-(ulong)(0.0 < dVar27) & (ulong)dVar27 |
                    (ulong)(1.0 / dVar27) & -(ulong)(0.0 < dVar27));
    dVar27 = (local_e8.m_xform[2][0] - local_168.m_xform[2][0]) * dVar5;
    dVar29 = (local_e8.m_xform[2][1] - local_168.m_xform[2][1]) * dVar5;
    dVar34 = (local_e8.m_xform[0][0] - local_168.m_xform[0][0]) * dVar5;
    dVar35 = (local_e8.m_xform[1][0] - local_168.m_xform[1][0]) * dVar5;
    dVar36 = (local_e8.m_xform[0][1] - local_168.m_xform[0][1]) * dVar5;
    dVar38 = (local_e8.m_xform[1][1] - local_168.m_xform[1][1]) * dVar5;
    dVar30 = dVar31;
    dVar32 = dVar33;
    iVar6 = num_der;
    do {
      dVar31 = pdVar12[-lVar11];
      dVar33 = (pdVar12 + -lVar11)[1];
      if (iVar6 + -1 == 0) {
LAB_003ca5af:
        dVar37 = dVar31 * dVar34 + dVar36 * dVar33 +
                 dVar5 * (local_e8.m_xform[0][3] - local_168.m_xform[0][3]);
        dVar39 = dVar31 * dVar35 + dVar38 * dVar33 +
                 dVar5 * (local_e8.m_xform[1][3] - local_168.m_xform[1][3]);
        dVar28 = dVar27 * dVar31 + dVar29 * dVar33 +
                 (local_e8.m_xform[2][3] - local_168.m_xform[2][3]) * dVar5;
      }
      else {
        iVar16 = 1;
        do {
          *pdVar7 = 0.0;
          pdVar7[1] = 0.0;
          pdVar7[2] = 0.0;
          iVar16 = iVar16 + 1;
          pdVar7 = pdVar7 + -lVar11;
        } while (iVar6 != iVar16);
        if (iVar6 == 1) goto LAB_003ca5af;
        dVar37 = dVar31 * dVar34 + dVar36 * dVar33;
        dVar39 = dVar31 * dVar35 + dVar38 * dVar33;
        dVar28 = dVar27 * dVar31 + dVar29 * dVar33;
      }
      pdVar12 = pdVar12 + -lVar11;
      *pdVar7 = dVar37;
      pdVar7[1] = dVar39;
      pdVar7[2] = dVar28;
      pdVar7 = pdVar7 + -lVar11;
      *pdVar7 = dVar30 * dVar23 + dVar4 * dVar32;
      pdVar7[1] = dVar30 * dVar24 + dStack_1a0 * dVar32;
      pdVar7[2] = dVar32 * dVar26 + dVar25 * dVar30;
      pdVar7 = pdVar7 + -lVar11;
      bVar18 = 1 < iVar6;
      dVar30 = dVar31;
      dVar32 = dVar33;
      iVar6 = iVar6 + -1;
    } while (bVar18);
  }
  *pdVar7 = dVar22 * local_168.m_xform[0][3] + dVar21 * local_e8.m_xform[0][3] +
            dVar23 * dVar31 + dVar4 * dVar33;
  pdVar7[1] = dVar22 * local_168.m_xform[1][3] + dVar21 * local_e8.m_xform[1][3] +
              dVar24 * dVar31 + dStack_1a0 * dVar33;
  pdVar7[2] = dVar22 * local_168.m_xform[2][3] + dVar21 * local_e8.m_xform[2][3] +
              dVar25 * dVar31 + dVar26 * dVar33;
  if (num_der < 1) {
    return true;
  }
  if (this->m_bTransposed != false) {
    iVar6 = 3;
    if (array_stride < 3) {
      iVar6 = array_stride;
    }
    uVar15 = (long)iVar6 << 3;
    pOVar8 = &local_168;
    if (0x80 < uVar15) {
      pOVar8 = (ON_Xform *)onmalloc(uVar15);
    }
    local_1c8 = der_array + lVar11;
    uVar9 = 1;
    local_1e0 = der_array;
    do {
      uVar1 = uVar9 + 1;
      if (0 < (long)(uVar9 * lVar11)) {
        iVar6 = ((int)uVar1 * (int)uVar9 * array_stride) / 2;
        pdVar7 = der_array + iVar6;
        pdVar12 = local_1c8 + iVar6;
        pdVar17 = local_1e0 + iVar6;
        do {
          memcpy(pOVar8,pdVar7,uVar15);
          memcpy(pdVar7,pdVar12,uVar15);
          memcpy(pdVar12,pOVar8,uVar15);
          pdVar7 = pdVar7 + lVar11;
          pdVar12 = pdVar12 + -lVar11;
          bVar18 = pdVar7 < pdVar17;
          pdVar17 = pdVar17 + -lVar11;
        } while (bVar18);
      }
      local_1e0 = local_1e0 + lVar11;
      local_1c8 = local_1c8 + lVar11;
      uVar9 = uVar1;
    } while (uVar1 != num_der + 1U);
    if (pOVar8 != &local_168) {
      onfree(pOVar8);
    }
    return true;
  }
  return true;
}

Assistant:

bool ON_Extrusion::Evaluate( // returns false if unable to evaluate
       double u, double v,   // evaluation parameters
       int num_der,          // number of derivatives (>=0)
       int array_stride,     // array stride (>=Dimension())
       double* der_array,    // array of length stride*(ndir+1)*(ndir+2)/2
       int quadrant ,     // optional - determines which quadrant to evaluate from
                             //         0 = default
                             //         1 from NE quadrant
                             //         2 from NW quadrant
                             //         3 from SW quadrant
                             //         4 from SE quadrant
       int* hint          // optional - evaluation hint (int[2]) used to speed
                             //            repeated evaluations
       ) const 
{
  if ( !m_profile )
    return false;

  double x,y,dx,dy;
  //int side = 0;
  if ( m_bTransposed ) 
  {
    x = u; u = v; v = x;
    if ( 4 == quadrant )
      quadrant = 2;
    else if ( 2 == quadrant )
      quadrant = 4;
  }

  if ( !m_profile->Evaluate( u, num_der, array_stride, der_array,
                             (1==quadrant||4==quadrant)?1:((2==quadrant||3==quadrant)?-1:0),
                               hint) 
     )
  {
    return false;
  }

  // TODO: After testing, add special case that avoids
  //       two calls to GetProfileTransformation() when 
  //       mitering is trivial.
  const double t1 = m_path_domain.NormalizedParameterAt(v);
  const double t0 = 1.0-t1;
  ON_Xform xform0, xform1;
  const ON_3dVector T = m_path.Tangent();

  if ( 0.0 != t0 || num_der > 0 )
  {
    if ( !ON_GetEndCapTransformation(m_path.PointAt(m_t.m_t[0]),T,m_up,m_bHaveN[0]?&m_N[0]:0,xform0,0,0) )
      return false;
  }
  else
  {
    xform0 = ON_Xform::Zero4x4;
  }

  if ( 0.0 != t1 || num_der > 0 )
  {
    if ( !ON_GetEndCapTransformation(m_path.PointAt(m_t.m_t[1]),T,m_up,m_bHaveN[1]?&m_N[1]:0,xform1,0,0) )
      return false;
  }
  else
  {
    xform1 = ON_Xform::Zero4x4;
  }

  double xformP[3][3], xformD[3][3];
  xformP[0][0] = t0*xform0.m_xform[0][0] + t1*xform1.m_xform[0][0];
  xformP[0][1] = t0*xform0.m_xform[0][1] + t1*xform1.m_xform[0][1];
  xformP[0][2] = t0*xform0.m_xform[0][3] + t1*xform1.m_xform[0][3];
  xformP[1][0] = t0*xform0.m_xform[1][0] + t1*xform1.m_xform[1][0];
  xformP[1][1] = t0*xform0.m_xform[1][1] + t1*xform1.m_xform[1][1];
  xformP[1][2] = t0*xform0.m_xform[1][3] + t1*xform1.m_xform[1][3];
  xformP[2][0] = t0*xform0.m_xform[2][0] + t1*xform1.m_xform[2][0];
  xformP[2][1] = t0*xform0.m_xform[2][1] + t1*xform1.m_xform[2][1];
  xformP[2][2] = t0*xform0.m_xform[2][3] + t1*xform1.m_xform[2][3];

  int i,j;
  i = num_der+1;
  double* d1 = der_array + array_stride*(i*(i+1)/2 - 1);
  double* d0 = der_array + array_stride*(i - 1);
  x = d0[0];
  y = d0[1];
  if ( num_der > 0 )
  {
    double d = m_path_domain.m_t[1] - m_path_domain.m_t[0];
    if ( d > 0.0 )
      d = 1.0/d;
    xformD[0][0] = d*(xform1.m_xform[0][0] - xform0.m_xform[0][0]);
    xformD[0][1] = d*(xform1.m_xform[0][1] - xform0.m_xform[0][1]);
    xformD[0][2] = d*(xform1.m_xform[0][3] - xform0.m_xform[0][3]);
    xformD[1][0] = d*(xform1.m_xform[1][0] - xform0.m_xform[1][0]);
    xformD[1][1] = d*(xform1.m_xform[1][1] - xform0.m_xform[1][1]);
    xformD[1][2] = d*(xform1.m_xform[1][3] - xform0.m_xform[1][3]);
    xformD[2][0] = d*(xform1.m_xform[2][0] - xform0.m_xform[2][0]);
    xformD[2][1] = d*(xform1.m_xform[2][1] - xform0.m_xform[2][1]);
    xformD[2][2] = d*(xform1.m_xform[2][3] - xform0.m_xform[2][3]);

    for ( i = num_der; i > 0; i-- )
    {
      dx = x;
      dy = y;
      d0 -= array_stride;
      x = d0[0];
      y = d0[1];

      // all partials involving two or more derivatives with
      // respect to "v" are zero.
      j = i;
      while ( --j )
      {
        d1[0] = d1[1] = d1[2] = 0.0;
        d1 -= array_stride;
      }    

      // The partial involving a single derivative with respect to "v"
      if ( 1 == i )
      {
        // xformD transform is applied to curve location ((x,y) = point)
        d1[0] = xformD[0][0]*x + xformD[0][1]*y + xformD[0][2];
        d1[1] = xformD[1][0]*x + xformD[1][1]*y + xformD[1][2];
        d1[2] = xformD[2][0]*x + xformD[2][1]*y + xformD[2][2];
      }
      else
      {
        // xformD transform is applied to a curve derivative ((x,y) = vector)
        d1[0] = xformD[0][0]*x + xformD[0][1]*y;
        d1[1] = xformD[1][0]*x + xformD[1][1]*y;
        d1[2] = xformD[2][0]*x + xformD[2][1]*y;
      }
      d1 -= array_stride;

      // The partial involving a all derivatives with respect to "u"
      // xformP transformation is applied to a curve derivative ((x,y) = vector)
      d1[0] = xformP[0][0]*dx + xformP[0][1]*dy;
      d1[1] = xformP[1][0]*dx + xformP[1][1]*dy;
      d1[2] = xformP[2][0]*dx + xformP[2][1]*dy;
      d1 -= array_stride;
    }
  }
  // xformP transformation is applied curve location ((x,y) = point)
  d1[0] = xformP[0][0]*x + xformP[0][1]*y + xformP[0][2];
  d1[1] = xformP[1][0]*x + xformP[1][1]*y + xformP[1][2];
  d1[2] = xformP[2][0]*x + xformP[2][1]*y + xformP[2][2];

  if ( m_bTransposed && num_der > 0)
  {
    // reverse order of derivatives
    const size_t sz = ((3 <= array_stride)?3:array_stride)*sizeof(double);
    void* tmp = ( sz <= sizeof(xform0) )
              ? ((void*)&xform0.m_xform[0][0])
              : onmalloc(sz);
    for ( i = 1; i <= num_der; i++ )
    {
      d0 = der_array + array_stride*(i*(i+1))/2;
      d1 = d0 + array_stride*i;
      while ( d0 < d1)
      {
        memcpy(tmp,d0,sz);
        memcpy(d0,d1,sz);
        memcpy(d1,tmp,sz);
        d0 += array_stride;
        d1 -= array_stride;
      }
    }
    if ( tmp != ((void*)&xform0.m_xform[0][0]) )
      onfree(tmp);
  }

  return true;
}